

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_exception_internal(TCGContext_conflict1 *tcg_ctx,int excp)

{
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  pTVar1 = tcg_const_i32_aarch64(tcg_ctx,0x10002);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_exception_internal_aarch64,(TCGTemp *)0x0,2,&local_28);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_exception_internal(TCGContext *tcg_ctx, int excp)
{
    TCGv_i32 tcg_excp = tcg_const_i32(tcg_ctx, excp);

    assert(excp_is_internal(excp));
    gen_helper_exception_internal(tcg_ctx, tcg_ctx->cpu_env, tcg_excp);
    tcg_temp_free_i32(tcg_ctx, tcg_excp);
}